

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Map.hpp
# Opt level: O2

Option<const_Kernel::TermList_&> __thiscall
Lib::Map<Kernel::PolyNf,_Kernel::TermList,_Lib::DefaultHash>::tryGet
          (Map<Kernel::PolyNf,_Kernel::TermList,_Lib::DefaultHash> *this,PolyNf *key)

{
  bool bVar1;
  uint uVar2;
  uint *puVar3;
  Coproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
  *in_RDX;
  uint *puVar4;
  uint *puVar5;
  
  uVar2 = Coproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
          ::defaultHash(in_RDX);
  uVar2 = uVar2 + (uVar2 == 0);
  puVar3 = *(uint **)((key->super_PolyNfSuper)._inner.
                      super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                      .
                      super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                      ._content + 7);
  puVar4 = (uint *)0x0;
  puVar5 = puVar3 + ((ulong)uVar2 %
                    (ulong)*(uint *)&(key->super_PolyNfSuper)._inner.
                                     super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                                     .
                                     super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                    ) * 10;
  do {
    if (*puVar5 == 0) {
LAB_00473cb8:
      *(uint **)this = puVar4;
      return (OptionBase<const_Kernel::TermList_&>)(OptionBase<const_Kernel::TermList_&>)this;
    }
    if (*puVar5 == uVar2) {
      bVar1 = Kernel::operator==((PolyNf *)(puVar5 + 1),(PolyNf *)in_RDX);
      if (bVar1) {
        puVar4 = puVar5 + 8;
        goto LAB_00473cb8;
      }
      puVar3 = *(uint **)((key->super_PolyNfSuper)._inner.
                          super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                          .
                          super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                          ._content + 7);
    }
    puVar5 = puVar5 + 10;
    if (puVar5 == *(uint **)((key->super_PolyNfSuper)._inner.
                             super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                             .
                             super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                             ._content + 0xf)) {
      puVar5 = puVar3;
    }
  } while( true );
}

Assistant:

Option<Val const&> tryGet(Key const& key) const
  {
    using Opt = Option<Val const&>;

    auto code = hashCode(key);
    Entry* entry;
    for (entry = firstEntryForCode(code); entry->occupied(); entry = nextEntry(entry)) {
      if (entry->code == code && Hash::equals(entry->key(),key)) {
        return Opt(entry->value());
      }
    }

    return Opt();
  }